

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int exprProbability(Expr *p)

{
  char *__s;
  size_t sVar1;
  uint length;
  int iVar2;
  double r;
  double local_20;
  
  local_20 = -1.0;
  iVar2 = -1;
  if (p->op == 0x84) {
    __s = (p->u).zToken;
    if (__s == (char *)0x0) {
      length = 0;
    }
    else {
      sVar1 = strlen(__s);
      length = (uint)sVar1 & 0x3fffffff;
    }
    sqlite3AtoF(__s,&local_20,length,'\x01');
    if (local_20 <= 1.0) {
      iVar2 = (int)(local_20 * 134217728.0);
    }
  }
  return iVar2;
}

Assistant:

static int exprProbability(Expr *p){
  double r = -1.0;
  if( p->op!=TK_FLOAT ) return -1;
  sqlite3AtoF(p->u.zToken, &r, sqlite3Strlen30(p->u.zToken), SQLITE_UTF8);
  assert( r>=0.0 );
  if( r>1.0 ) return -1;
  return (int)(r*134217728.0);
}